

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

PSprite __thiscall SpriteBase::get_masked(SpriteBase *this,PSprite *mask)

{
  uint uVar1;
  _func_int ***ppp_Var2;
  _Alloc_hider _Var3;
  size_type sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  uint *puVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  ExceptionFreeserf *this_00;
  undefined8 *in_RDX;
  long lVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  size_t x;
  ulong uVar12;
  undefined1 auVar13 [16];
  PSprite PVar14;
  allocator<char> local_71;
  SpriteBase *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  ulong local_58;
  string local_50;
  
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(**(code **)(*(long *)*in_RDX + 8))();
  if (p_Var5 <= mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi) {
    std::make_shared<SpriteBase,std::shared_ptr<Data::Sprite>&>
              ((shared_ptr<Data::Sprite> *)&local_50);
    sVar4 = local_50._M_string_length;
    _Var3._M_p = local_50._M_dataplus._M_p;
    (this->super_Sprite)._vptr_Sprite = (_func_int **)local_50._M_dataplus._M_p;
    local_50._M_string_length = 0;
    (this->super_Sprite).super_enable_shared_from_this<Data::Sprite>._M_weak_this.
    super___weak_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar4;
    local_50._M_dataplus._M_p = (pointer)0x0;
    local_70 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    puVar6 = (uint *)(**(code **)*(_func_int **)_Var3._M_p)(_Var3._M_p);
    local_68 = mask[2].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    local_60 = mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    lVar10 = (long)mask[3].super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
             (long)local_68;
    lVar7 = (**(code **)(*(_func_int **)_Var3._M_p + 8))(_Var3._M_p);
    puVar8 = (uint *)(*(code *)**(undefined8 **)*in_RDX)();
    ppp_Var2 = &local_60->_vptr__Sp_counted_base;
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_68 - lVar7);
    uVar9 = 0;
    p_Var5 = local_60;
    while( true ) {
      auVar13 = (**(code **)(*(_func_int **)_Var3._M_p + 0x10))(_Var3._M_p);
      PVar14.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           auVar13._8_8_;
      if (auVar13._0_8_ <= uVar9) break;
      uVar12 = 0;
      local_58 = uVar9;
      while( true ) {
        uVar9 = (**(code **)(*(_func_int **)_Var3._M_p + 8))(_Var3._M_p);
        if (uVar9 <= uVar12) break;
        p_Var11 = p_Var5;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)ppp_Var2 + lVar10 * 4) <= p_Var5)
        {
          p_Var11 = local_60;
        }
        uVar1 = *puVar8;
        puVar8 = puVar8 + 1;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&p_Var11->_vptr__Sp_counted_base + 4);
        *puVar6 = uVar1 & *(uint *)&p_Var11->_vptr__Sp_counted_base;
        puVar6 = puVar6 + 1;
        uVar12 = uVar12 + 1;
      }
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var5->_vptr__Sp_counted_base + (long)local_68 * 4);
      uVar9 = local_58 + 1;
    }
    PVar14.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_70->super_Sprite;
    return (PSprite)PVar14.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Failed to apply mask to sprite",&local_71);
  ExceptionFreeserf::ExceptionFreeserf(this_00,&local_50);
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

Data::PSprite
SpriteBase::get_masked(Data::PSprite mask) {
  if (mask->get_width() > width) {
    throw ExceptionFreeserf("Failed to apply mask to sprite");
  }

  Data::PSprite masked = std::make_shared<SpriteBase>(mask);

  uint32_t *pos = reinterpret_cast<uint32_t*>(masked->get_data());

  uint32_t *s_beg = reinterpret_cast<uint32_t*>(data);
  uint32_t *s_pos = s_beg;
  uint32_t *s_end = s_beg + (width * height);
  size_t s_delta = width - masked->get_width();

  uint32_t *m_pos = reinterpret_cast<uint32_t*>(mask->get_data());

  for (size_t y = 0; y < masked->get_height(); y++) {
    for (size_t x = 0; x < masked->get_width(); x++) {
      if (s_pos >= s_end) {
        s_pos = s_beg;
      }
      *pos++ = *s_pos++ & *m_pos++;
    }
    s_pos += s_delta;
  }

  return masked;
}